

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

void Saig_ManBmcWriteBlif(Aig_Man_t *p,Vec_Int_t *vMapping,char *pFileName)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  uint *puVar5;
  int local_64;
  int Lit;
  int *pData;
  int iTruth;
  int iFan;
  int b;
  int k;
  int i;
  char Vals [4];
  Aig_Obj_t *pObj;
  char **pSops;
  char *pSopSizes;
  FILE *pFile;
  char *pFileName_local;
  Vec_Int_t *vMapping_local;
  Aig_Man_t *p_local;
  
  pFile = (FILE *)pFileName;
  pFileName_local = (char *)vMapping;
  vMapping_local = (Vec_Int_t *)p;
  pSopSizes = (char *)fopen(pFileName,"w");
  if ((FILE *)pSopSizes == (FILE *)0x0) {
    Abc_Print(1,"Cannot open file %s\n",pFile);
  }
  else {
    fprintf((FILE *)pSopSizes,".model test\n");
    fprintf((FILE *)pSopSizes,".inputs");
    for (b = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(vMapping_local + 1)), b < iVar2; b = b + 1) {
      _i = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vMapping_local + 1),b);
      pcVar1 = pSopSizes;
      uVar3 = Aig_ObjId(_i);
      fprintf((FILE *)pcVar1," n%d",(ulong)uVar3);
    }
    fprintf((FILE *)pSopSizes,"\n");
    fprintf((FILE *)pSopSizes,".outputs");
    for (b = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)vMapping_local[1].pArray), b < iVar2; b = b + 1) {
      _i = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vMapping_local[1].pArray,b);
      pcVar1 = pSopSizes;
      uVar3 = Aig_ObjId(_i);
      fprintf((FILE *)pcVar1," n%d",(ulong)uVar3);
    }
    fprintf((FILE *)pSopSizes,"\n");
    fprintf((FILE *)pSopSizes,".names");
    pcVar1 = pSopSizes;
    pAVar4 = Aig_ManConst1((Aig_Man_t *)vMapping_local);
    uVar3 = Aig_ObjId(pAVar4);
    fprintf((FILE *)pcVar1," n%d\n",(ulong)uVar3);
    fprintf((FILE *)pSopSizes," 1\n");
    Cnf_ReadMsops((char **)&pSops,(char ***)&pObj);
    for (b = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(vMapping_local + 2)), b < iVar2; b = b + 1) {
      _i = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vMapping_local + 2),b);
      if (((_i != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(_i), iVar2 != 0)) &&
         (iVar2 = Vec_IntEntry((Vec_Int_t *)pFileName_local,b), pcVar1 = pFileName_local, iVar2 != 0
         )) {
        iVar2 = Vec_IntEntry((Vec_Int_t *)pFileName_local,b);
        puVar5 = (uint *)Vec_IntEntryP((Vec_Int_t *)pcVar1,iVar2);
        fprintf((FILE *)pSopSizes,".names");
        pData._4_4_ = 0;
        while ((pData._4_4_ < 4 && (-1 < (int)puVar5[pData._4_4_ + 1]))) {
          fprintf((FILE *)pSopSizes," n%d",(ulong)puVar5[pData._4_4_ + 1]);
          pData._4_4_ = pData._4_4_ + 1;
        }
        fprintf((FILE *)pSopSizes," n%d\n",(ulong)(uint)b);
        uVar3 = *puVar5;
        for (iFan = 0; iFan < *(char *)((long)pSops + (long)(int)(uVar3 & 0xffff)); iFan = iFan + 1)
        {
          local_64 = (int)*(char *)((long)&((&pObj->field_0)[(int)(uVar3 & 0xffff)].pNext)->field_0
                                   + (long)iFan);
          for (iTruth = 3; -1 < iTruth; iTruth = iTruth + -1) {
            if (local_64 % 3 == 0) {
              *(undefined1 *)((long)&k + (long)iTruth) = 0x30;
            }
            else if (local_64 % 3 == 1) {
              *(undefined1 *)((long)&k + (long)iTruth) = 0x31;
            }
            else {
              *(undefined1 *)((long)&k + (long)iTruth) = 0x2d;
            }
            local_64 = local_64 / 3;
          }
          for (iTruth = 0; iTruth < pData._4_4_; iTruth = iTruth + 1) {
            fprintf((FILE *)pSopSizes,"%c",(ulong)(uint)(int)*(char *)((long)&k + (long)iTruth));
          }
          fprintf((FILE *)pSopSizes," 1\n");
        }
      }
    }
    free(pSops);
    free(pObj->pFanin0);
    free(pObj);
    for (b = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)vMapping_local[1].pArray), b < iVar2; b = b + 1) {
      _i = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vMapping_local[1].pArray,b);
      fprintf((FILE *)pSopSizes,".names");
      pcVar1 = pSopSizes;
      pAVar4 = Aig_ObjFanin0(_i);
      uVar3 = Aig_ObjId(pAVar4);
      fprintf((FILE *)pcVar1," n%d",(ulong)uVar3);
      pcVar1 = pSopSizes;
      uVar3 = Aig_ObjId(_i);
      fprintf((FILE *)pcVar1," n%d\n",(ulong)uVar3);
      pcVar1 = pSopSizes;
      iVar2 = Aig_ObjFaninC0(_i);
      fprintf((FILE *)pcVar1,"%d 1\n",(ulong)((iVar2 != 0 ^ 0xffU) & 1));
    }
    fprintf((FILE *)pSopSizes,".end\n");
    fclose((FILE *)pSopSizes);
  }
  return;
}

Assistant:

void Saig_ManBmcWriteBlif( Aig_Man_t * p, Vec_Int_t * vMapping, char * pFileName )
{
    FILE * pFile;
    char * pSopSizes, ** pSops;
    Aig_Obj_t * pObj;
    char Vals[4];
    int i, k, b, iFan, iTruth, * pData;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file %s\n", pFileName );
        return;
    }
    fprintf( pFile, ".model test\n" );
    fprintf( pFile, ".inputs" );
    Aig_ManForEachCi( p, pObj, i )
        fprintf( pFile, " n%d", Aig_ObjId(pObj) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    Aig_ManForEachCo( p, pObj, i )
        fprintf( pFile, " n%d", Aig_ObjId(pObj) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".names" );
    fprintf( pFile, " n%d\n", Aig_ObjId(Aig_ManConst1(p)) );
    fprintf( pFile, " 1\n" );

    Cnf_ReadMsops( &pSopSizes, &pSops );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Vec_IntEntry(vMapping, i) == 0 )
            continue;
        pData = Vec_IntEntryP( vMapping, Vec_IntEntry(vMapping, i) );
        fprintf( pFile, ".names" );
        for ( iFan = 0; iFan < 4; iFan++ )
            if ( pData[iFan+1] >= 0 )
                fprintf( pFile, " n%d", pData[iFan+1] );
            else
                break;
        fprintf( pFile, " n%d\n", i );
        // write SOP
        iTruth = pData[0] & 0xffff;
        for ( k = 0; k < pSopSizes[iTruth]; k++ )
        {
            int Lit = pSops[iTruth][k];
            for ( b = 3; b >= 0; b-- )
            {
                if ( Lit % 3 == 0 )
                    Vals[b] = '0';
                else if ( Lit % 3 == 1 )
                    Vals[b] = '1';
                else
                    Vals[b] = '-';
                Lit = Lit / 3;
            }
            for ( b = 0; b < iFan; b++ )
                fprintf( pFile, "%c", Vals[b] );
            fprintf( pFile, " 1\n" );
        }
    }
    free( pSopSizes );
    free( pSops[1] );
    free( pSops );

    Aig_ManForEachCo( p, pObj, i )
    {
        fprintf( pFile, ".names" );
        fprintf( pFile, " n%d", Aig_ObjId(Aig_ObjFanin0(pObj)) );
        fprintf( pFile, " n%d\n", Aig_ObjId(pObj) );
        fprintf( pFile, "%d 1\n", !Aig_ObjFaninC0(pObj) );
    }
    fprintf( pFile, ".end\n" );
    fclose( pFile );
}